

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Alloc.h
# Opt level: O0

void __thiscall
Glucose::RegionAllocator<unsigned_int>::capacity
          (RegionAllocator<unsigned_int> *this,uint32_t min_cap)

{
  uint uVar1;
  undefined8 uVar2;
  void *pvVar3;
  uint in_ESI;
  undefined8 *in_RDI;
  uint32_t delta;
  uint32_t prev_cap;
  size_t in_stack_ffffffffffffffd8;
  
  if (*(uint *)((long)in_RDI + 0xc) < in_ESI) {
    uVar1 = *(uint *)((long)in_RDI + 0xc);
    while (*(uint *)((long)in_RDI + 0xc) < in_ESI) {
      *(uint *)((long)in_RDI + 0xc) =
           ((*(uint *)((long)in_RDI + 0xc) >> 1) + (*(uint *)((long)in_RDI + 0xc) >> 3) + 2 &
           0xfffffffe) + *(int *)((long)in_RDI + 0xc);
      if (*(uint *)((long)in_RDI + 0xc) <= uVar1) {
        uVar2 = __cxa_allocate_exception(1);
        __cxa_throw(uVar2,&OutOfMemoryException::typeinfo,0);
      }
    }
    pvVar3 = xrealloc(in_RDI,in_stack_ffffffffffffffd8);
    *in_RDI = pvVar3;
  }
  return;
}

Assistant:

void RegionAllocator<T>::capacity(uint32_t min_cap)
{
    if (cap >= min_cap) return;
    uint32_t prev_cap = cap;
    while (cap < min_cap){
        // NOTE: Multiply by a factor (13/8) without causing overflow, then add 2 and make the
        // result even by clearing the least significant bit. The resulting sequence of capacities
        // is carefully chosen to hit a maximum capacity that is close to the '2^32-1' limit when
        // using 'uint32_t' as indices so that as much as possible of this space can be used.
        uint32_t delta = ((cap >> 1) + (cap >> 3) + 2) & ~1;
        cap += delta;

        if (cap <= prev_cap)
            throw OutOfMemoryException();
    }
    //printf(" .. (%p) cap = %u\n", this, cap);

    assert(cap > 0);
    memory = (T*)xrealloc(memory, sizeof(T)*cap);
}